

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMLSSerializerImpl::setParameter(DOMLSSerializerImpl *this,XMLCh *featName,bool state)

{
  DOMException *this_00;
  uint uVar1;
  int featureId;
  uint local_24;
  
  local_24 = 0xffffffff;
  checkFeature(this,featName,true,(int *)&local_24);
  if (featuresSupported[(int)((uint)!state + local_24 * 2)] != '\0') {
    uVar1 = 1 << ((byte)local_24 & 0x1f);
    if (state) {
      this->fFeatures = this->fFeatures | uVar1;
    }
    else {
      this->fFeatures = this->fFeatures & ~uVar1;
    }
    if (local_24 == 0 && state) {
      this->fFeatures = this->fFeatures & 0xfffff9f5;
    }
    if (((local_24 < 10) && ((0x20aU >> (local_24 & 0x1f) & 1) != 0)) && (state)) {
      *(byte *)&this->fFeatures = (byte)this->fFeatures & 0xfe;
    }
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,9,0,this->fMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMLSSerializerImpl::setParameter(const XMLCh* featName
                                     , bool         state)
{
    int featureId = INVALID_FEATURE_ID;
    checkFeature(featName, true, featureId);

    if (!canSetFeature(featureId, state))
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

    setFeature(featureId, state);

    //
    // setting "canonical-form" to true will set the parameters "format-pretty-print",
    // "discard-default-content", and "xml-declaration", to false
    //
    if ((featureId == CANONICAL_FORM_ID) && state)
    {
        setFeature(FORMAT_PRETTY_PRINT_ID, false);
        setFeature(FORMAT_PRETTY_PRINT_1ST_LEVEL_ID, false);
        setFeature(DISCARD_DEFAULT_CONTENT_ID, false);
        setFeature(XML_DECLARATION, false);
    }
    // Setting one of those parameters to true will set "canonical-form" to false.
    if ((featureId == FORMAT_PRETTY_PRINT_ID || featureId == DISCARD_DEFAULT_CONTENT_ID || featureId == XML_DECLARATION) && state)
        setFeature(CANONICAL_FORM_ID, false);
}